

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O3

int lyb_parse_model(char *data,lys_module **mod,lyb_state *lybs)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  lys_module *plVar4;
  int iVar5;
  char *format;
  ulong *revision;
  ly_ctx *plVar6;
  void *pvVar7;
  char *pcVar8;
  char *__ptr;
  ulong *buf;
  ulong local_58;
  char mod_rev [11];
  char *local_38;
  char *mod_name;
  
  local_38 = (char *)0x0;
  uVar2 = lyb_read_string(data,&local_38,1,lybs);
  if (-1 < (int)uVar2) {
    buf = &local_58;
    local_58 = 0;
    iVar3 = lyb_read(data + uVar2,(uint8_t *)buf,2,lybs);
    if (-1 < iVar3) {
      sVar1 = (short)local_58;
      unique0x100001d5 = mod;
      if (sVar1 == 0) {
        plVar6 = lybs->ctx;
        revision = (ulong *)0x0;
      }
      else {
        sprintf((char *)&local_58,"%04u-%02u-%02u",(ulong)(((uint)(local_58 >> 9) & 0x7f) + 2000),
                (ulong)((uint)(local_58 >> 5) & 0xf),(ulong)((uint)local_58 & 0x1f));
        plVar6 = lybs->ctx;
        revision = &local_58;
      }
      __ptr = local_38;
      plVar4 = ly_ctx_get_module(plVar6,local_38,(char *)revision,0);
      *stack0xffffffffffffffb8 = plVar4;
      plVar6 = lybs->ctx;
      if (plVar6->data_clb == (ly_module_data_clb)0x0) {
LAB_0014468d:
        if (plVar4 != (lys_module *)0x0) goto LAB_00144692;
        plVar6 = lybs->ctx;
        pcVar8 = "@";
        if (sVar1 == 0) {
          pcVar8 = "";
          buf = (ulong *)0x1a29e4;
        }
        format = "Invalid context for LYB data parsing, missing module \"%s%s%s\".";
      }
      else {
        if (plVar4 == (lys_module *)0x0) {
          pvVar7 = plVar6->data_clb_data;
          pcVar8 = (char *)0x0;
          iVar5 = 0;
LAB_00144683:
          plVar4 = (*plVar6->data_clb)(plVar6,__ptr,pcVar8,iVar5,pvVar7);
          *stack0xffffffffffffffb8 = plVar4;
          goto LAB_0014468d;
        }
        if ((plVar4->field_0x40 & 0x80) == 0) {
          pcVar8 = plVar4->ns;
          pvVar7 = plVar6->data_clb_data;
          iVar5 = 1;
          goto LAB_00144683;
        }
LAB_00144692:
        if ((plVar4->field_0x40 & 0x80) != 0) {
          iVar3 = iVar3 + uVar2;
          goto LAB_0014470e;
        }
        plVar6 = lybs->ctx;
        pcVar8 = "@";
        if (sVar1 == 0) {
          pcVar8 = "";
          buf = (ulong *)0x1a29e4;
        }
        format = "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.";
      }
      ly_log(plVar6,LY_LLERR,LY_EINVAL,format,__ptr,pcVar8,buf);
    }
  }
  iVar3 = -1;
  __ptr = local_38;
LAB_0014470e:
  free(__ptr);
  return iVar3;
}

Assistant:

static int
lyb_parse_model(const char *data, const struct lys_module **mod, struct lyb_state *lybs)
{
    int r, ret = 0;
    char *mod_name = NULL, mod_rev[11];
    uint16_t rev;

    /* model name */
    ret += (r = lyb_read_string(data, &mod_name, 1, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    /* revision */
    ret += (r = lyb_read_number(&rev, sizeof rev, 2, data, lybs));
    LYB_HAVE_READ_GOTO(r, data, error);

    if (rev) {
        sprintf(mod_rev, "%04u-%02u-%02u", ((rev & 0xFE00) >> 9) + 2000, (rev & 0x01E0) >> 5, (rev & 0x001F));
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, mod_rev, 0);
    } else {
        *mod = ly_ctx_get_module(lybs->ctx, mod_name, NULL, 0);
    }
    if (lybs->ctx->data_clb) {
        if (!*mod) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, NULL, 0, lybs->ctx->data_clb_data);
        } else if (!(*mod)->implemented) {
            *mod = lybs->ctx->data_clb(lybs->ctx, mod_name, (*mod)->ns, LY_MODCLB_NOT_IMPLEMENTED, lybs->ctx->data_clb_data);
        }
    }

    if (!*mod) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, missing module \"%s%s%s\".",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    } else if (!(*mod)->implemented) {
        LOGERR(lybs->ctx, LY_EINVAL, "Invalid context for LYB data parsing, module \"%s%s%s\" not implemented.",
               mod_name, rev ? "@" : "", rev ? mod_rev : "");
        goto error;
    }

    free(mod_name);
    return ret;

error:
    free(mod_name);
    return -1;
}